

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

void write1_cb(uv_write_t *req,int status)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  uv_stream_t *puVar3;
  long *extraout_RDX;
  uv_write_t *unaff_RBX;
  int iVar4;
  undefined4 in_register_00000034;
  uv_stream_t *handle;
  undefined8 in_R9;
  uv_buf_t uStack_b0;
  code *pcStack_a0;
  sockaddr_in sStack_98;
  uv_connect_t uStack_88;
  uv_write_t *puStack_28;
  uv_write_t *puStack_20;
  uv_buf_t local_18;
  
  handle = (uv_stream_t *)CONCAT44(in_register_00000034,status);
  if (req == (uv_write_t *)0x0) {
    puStack_20 = (uv_write_t *)0x1710f1;
    write1_cb_cold_3();
  }
  else {
    unaff_RBX = req;
    if (status != 0) {
      if (shutdown_cb_called != 0) {
        return;
      }
      puStack_20 = (uv_write_t *)0x171096;
      write1_cb_cold_1();
      unaff_RBX = req;
    }
    if (shutdown_requested != 0) {
      return;
    }
    puStack_20 = (uv_write_t *)0x1710b3;
    local_18 = uv_buf_init("P",1);
    handle = unaff_RBX->handle;
    req = &write_req;
    puStack_20 = (uv_write_t *)0x1710dc;
    iVar1 = uv_write(&write_req,handle,&local_18,1,write1_cb);
    if (iVar1 == 0) {
      write_cb_called = write_cb_called + 1;
      return;
    }
  }
  puStack_20 = (uv_write_t *)read1_cb;
  write1_cb_cold_2();
  puStack_20 = unaff_RBX;
  if (req == (uv_write_t *)0x0) {
LAB_00171145:
    puStack_28 = (uv_write_t *)0x17114a;
    read1_cb_cold_3();
  }
  else {
    if (-1 < (long)handle) {
      if (handle != (uv_stream_t *)0x0) {
        puVar3 = (uv_stream_t *)0x0;
        do {
          if (*(char *)((long)puVar3->handle_queue + *extraout_RDX + -0x20) != 'P') {
            puStack_28 = (uv_write_t *)0x171145;
            read1_cb_cold_2();
            goto LAB_00171145;
          }
          puVar3 = (uv_stream_t *)((long)&puVar3->data + 1);
        } while (handle != puVar3);
      }
      return;
    }
    if (handle == (uv_stream_t *)0xfffffffffffff001) {
      puStack_28 = (uv_write_t *)0x171130;
      puts("GOT EOF");
      uv_close((uv_handle_t *)req,close_cb);
      return;
    }
  }
  puStack_28 = (uv_write_t *)0x17114f;
  read1_cb_cold_1();
  iVar4 = 0x23a3;
  pcStack_a0 = (code *)0x171169;
  puStack_28 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_98);
  if (iVar1 == 0) {
    pcStack_a0 = (code *)0x171176;
    puVar2 = uv_default_loop();
    iVar4 = 0x347938;
    pcStack_a0 = (code *)0x171185;
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    if (iVar1 != 0) goto LAB_00171218;
    pcStack_a0 = (code *)0x171192;
    puVar2 = uv_default_loop();
    iVar4 = 0x3479d0;
    pcStack_a0 = (code *)0x1711a1;
    iVar1 = uv_tcp_init(puVar2,&tcp_handle);
    if (iVar1 != 0) goto LAB_0017121d;
    iVar4 = 0x3479d0;
    pcStack_a0 = (code *)0x1711c0;
    iVar1 = uv_tcp_connect(&uStack_88,&tcp_handle,(sockaddr *)&sStack_98,connect_cb);
    if (iVar1 != 0) goto LAB_00171222;
    pcStack_a0 = (code *)0x1711c9;
    puVar2 = uv_default_loop();
    iVar4 = 0;
    pcStack_a0 = (code *)0x1711d3;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00171227;
    pcStack_a0 = (code *)0x1711dc;
    puVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1711f0;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    iVar4 = 0;
    pcStack_a0 = (code *)0x1711fa;
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcStack_a0 = (code *)0x1711ff;
    puVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x171207;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_a0 = (code *)0x171218;
    run_test_tcp_read_stop_cold_1();
LAB_00171218:
    pcStack_a0 = (code *)0x17121d;
    run_test_tcp_read_stop_cold_2();
LAB_0017121d:
    pcStack_a0 = (code *)0x171222;
    run_test_tcp_read_stop_cold_3();
LAB_00171222:
    pcStack_a0 = (code *)0x171227;
    run_test_tcp_read_stop_cold_4();
LAB_00171227:
    pcStack_a0 = (code *)0x17122c;
    run_test_tcp_read_stop_cold_5();
  }
  pcStack_a0 = connect_cb;
  run_test_tcp_read_stop_cold_6();
  if (iVar4 == 0) {
    uStack_b0.len = 0x171250;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    if (iVar1 == 0) {
      uStack_b0.len = 0x17126a;
      iVar1 = uv_read_start((uv_stream_t *)&tcp_handle,fail_cb,fail_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0017127a;
    }
  }
  else {
    uStack_b0.len = 0x171275;
    connect_cb_cold_1();
  }
  uStack_b0.len = 0x17127a;
  connect_cb_cold_2();
LAB_0017127a:
  uStack_b0.len = (size_t)timer_cb;
  connect_cb_cold_3();
  uStack_b0 = uv_buf_init("PING",4);
  iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_handle,&uStack_b0,1,write_cb);
  if (iVar1 == 0) {
    iVar1 = uv_read_stop((uv_stream_t *)&tcp_handle);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    timer_cb_cold_1();
  }
  timer_cb_cold_2();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-read-stop.c"
          ,0x1f,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

static void write1_cb(uv_write_t* req, int status) {
  uv_buf_t buf;
  int r;

  ASSERT(req != NULL);
  if (status) {
    ASSERT(shutdown_cb_called);
    return;
  }

  if (shutdown_requested)
    return;

  buf = uv_buf_init("P", 1);
  r = uv_write(&write_req, req->handle, &buf, 1, write1_cb);
  ASSERT(r == 0);

  write_cb_called++;
}